

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O2

void __thiscall internalJSONNode::Set(internalJSONNode *this,bool val)

{
  undefined7 in_register_00000031;
  
  this->_type = '\x03';
  (this->_value)._bool = val;
  if ((int)CONCAT71(in_register_00000031,val) == 0) {
    jsonSingletonCONST_FALSE::getValue_abi_cxx11_();
  }
  else {
    jsonSingletonCONST_TRUE::getValue_abi_cxx11_();
  }
  std::__cxx11::string::_M_assign((string *)&this->_string);
  this->fetched = true;
  return;
}

Assistant:

void internalJSONNode::Set(bool val) json_nothrow {
    makeNotContainer();
    _type = JSON_BOOL;
    _value._bool = val;
    #if(defined(JSON_CASTABLE) || !defined(JSON_LESS_MEMORY) || defined(JSON_WRITE_PRIORITY))
	   _string = val ? json_global(CONST_TRUE) : json_global(CONST_FALSE);
    #endif
    SetFetched(true);
}